

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O3

void __thiscall ON_PointGrid::Dump(ON_PointGrid *this,ON_TextLog *dump)

{
  ON_TextLog::Print(dump,"ON_PointGrid size = %d X %d\n",(ulong)(uint)this->m_point_count[0],
                    (ulong)(uint)this->m_point_count[1]);
  if (0 < (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count) {
    ON_TextLog::PrintPointGrid
              (dump,3,false,this->m_point_count[0],this->m_point_count[1],this->m_point_stride0 * 3,
               3,&((this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a)->x,"  point");
    return;
  }
  ON_TextLog::Print(dump,"  NO point array\n");
  return;
}

Assistant:

void ON_PointGrid::Dump( ON_TextLog& dump ) const
{
  dump.Print( "ON_PointGrid size = %d X %d\n",
               m_point_count[0], m_point_count[1] );
  if ( m_point.Count() < 1 ) {
    dump.Print("  NO point array\n");
  }
  else {
    dump.PrintPointGrid( 3, false, m_point_count[0], m_point_count[1], 
                         3*m_point_stride0, 3, 
                         &m_point[0].x,
                         "  point" 
                         );
  }
}